

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::transform
          (LightNodeImpl<embree::SceneGraph::SpotLight> *this,AffineSpace3fa *space)

{
  _func_int *p_Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  _func_int *p_Var24;
  _func_int *p_Var25;
  _func_int **pp_Var26;
  float *in_RDX;
  
  pp_Var26 = (_func_int **)alignedMalloc(0xc0,0x10);
  fVar2 = space[2].l.vx.field_0.m128[0];
  fVar3 = space[2].l.vx.field_0.m128[1];
  fVar4 = space[2].l.vx.field_0.m128[2];
  fVar5 = *in_RDX;
  fVar6 = in_RDX[1];
  fVar7 = in_RDX[2];
  fVar8 = in_RDX[3];
  fVar9 = in_RDX[8];
  fVar10 = in_RDX[9];
  fVar11 = in_RDX[10];
  fVar12 = in_RDX[0xb];
  fVar13 = in_RDX[0xc];
  fVar14 = in_RDX[0xd];
  fVar15 = in_RDX[0xe];
  fVar16 = in_RDX[0xf];
  fVar17 = in_RDX[4];
  fVar18 = in_RDX[5];
  fVar19 = in_RDX[6];
  fVar20 = in_RDX[7];
  fVar21 = space[2].l.vy.field_0.m128[0];
  fVar22 = space[2].l.vy.field_0.m128[1];
  fVar23 = space[2].l.vy.field_0.m128[2];
  p_Var24 = *(_func_int **)&space[2].l.vz.field_0;
  p_Var25 = *(_func_int **)((long)&space[2].l.vz.field_0 + 8);
  p_Var1 = *(_func_int **)&space[2].p.field_0;
  pp_Var26[1] = (_func_int *)0x0;
  pp_Var26[2] = (_func_int *)(pp_Var26 + 4);
  pp_Var26[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var26 + 4) = 0;
  pp_Var26[6] = (_func_int *)(pp_Var26 + 8);
  pp_Var26[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var26 + 8) = 0;
  pp_Var26[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var26 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var26 + 0x5c) = 0xffffffff;
  pp_Var26[0xc] = (_func_int *)0x0;
  *pp_Var26 = (_func_int *)&PTR__Node_0026ab08;
  *(undefined4 *)(pp_Var26 + 0xe) = 3;
  *(float *)(pp_Var26 + 0x10) = fVar2 * fVar5 + fVar3 * fVar17 + fVar4 * fVar9 + fVar13;
  *(float *)((long)pp_Var26 + 0x84) = fVar2 * fVar6 + fVar3 * fVar18 + fVar4 * fVar10 + fVar14;
  *(float *)(pp_Var26 + 0x11) = fVar2 * fVar7 + fVar3 * fVar19 + fVar4 * fVar11 + fVar15;
  *(float *)((long)pp_Var26 + 0x8c) = fVar2 * fVar8 + fVar3 * fVar20 + fVar4 * fVar12 + fVar16;
  *(float *)(pp_Var26 + 0x12) = fVar21 * fVar5 + fVar22 * fVar17 + fVar23 * fVar9;
  *(float *)((long)pp_Var26 + 0x94) = fVar21 * fVar6 + fVar22 * fVar18 + fVar23 * fVar10;
  *(float *)(pp_Var26 + 0x13) = fVar21 * fVar7 + fVar22 * fVar19 + fVar23 * fVar11;
  *(float *)((long)pp_Var26 + 0x9c) = fVar21 * fVar8 + fVar22 * fVar20 + fVar23 * fVar12;
  pp_Var26[0x14] = p_Var24;
  pp_Var26[0x15] = p_Var25;
  pp_Var26[0x16] = p_Var1;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var26;
  LOCK();
  pp_Var26[1] = pp_Var26[1] + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }